

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusPerpIntercept.cpp
# Opt level: O1

int GeoCalcs::LocusPerpIntercept
              (Locus *loc,LLPoint *pt2,double *crsFromPt,double *distFromPt,LLPoint *intPt,
              double dTol)

{
  double dVar1;
  uint uVar2;
  LLPoint LVar3;
  double newDist;
  LLPoint geoPt;
  InverseResult result;
  double local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  double local_b8;
  double dStack_b0;
  LLPoint *local_a8;
  double *local_a0;
  double *local_98;
  double local_90;
  LLPoint local_88;
  InverseResult local_78;
  double local_60;
  LLPoint local_58;
  double local_48;
  
  local_78.azimuth = 0.0;
  local_78.reverseAzimuth = 0.0;
  local_78.distance = 0.0;
  DistVincenty(&loc->geoStart,&loc->geoEnd,&local_78);
  if (dTol <= ABS(loc->startDist - loc->endDist)) {
    local_c8 = local_78.distance;
    local_90 = local_78.azimuth;
    local_a8 = intPt;
    DistVincenty(&loc->locusStart,&loc->locusEnd,&local_78);
    LVar3 = PerpIntercept(&loc->locusStart,local_78.azimuth,pt2,crsFromPt,distFromPt,dTol);
    local_88.longitude = LVar3.longitude;
    local_88.latitude = LVar3.latitude;
    local_a0 = distFromPt;
    local_98 = crsFromPt;
    LVar3 = PerpIntercept(&loc->geoStart,local_90,&local_88,crsFromPt,distFromPt,dTol);
    local_58.longitude = LVar3.longitude;
    local_58.latitude = LVar3.latitude;
    local_60 = atan((loc->startDist - loc->endDist) / local_c8);
    local_b8 = 0.0;
    dStack_b0 = 0.0;
    local_d8 = 0.0;
    dStack_d0 = 0.0;
    DistVincenty(&loc->geoStart,&local_58,&local_78);
    dStack_d0 = local_78.distance;
    local_e0 = 0.0;
    uVar2 = 0;
    while( true ) {
      if ((uVar2 != 0) && (((NAN(local_e0) || (0xe < uVar2)) || (ABS(dStack_b0) <= dTol))))
      goto LAB_00159e04;
      LVar3 = DestVincenty(&loc->geoStart,local_90,dStack_d0);
      local_58.longitude = LVar3.longitude;
      local_58.latitude = LVar3.latitude;
      LVar3 = PointOnLocusP(loc,&local_58,dTol,5e-16);
      local_88.longitude = LVar3.longitude;
      local_88.latitude = LVar3.latitude;
      DistVincenty(&local_88,pt2,&local_78);
      local_c8 = -local_78.distance;
      uStack_c0 = 0;
      uStack_bc = 0x80000000;
      dVar1 = LocusCrsAtPoint(loc,&local_88,&local_58,1e-08);
      dVar1 = SignAzimuthDifference(dVar1,local_78.azimuth);
      dStack_b0 = cos(dVar1);
      dStack_b0 = dStack_b0 * local_c8;
      if (ABS(dStack_b0) < dTol) break;
      if (uVar2 == 0) {
        local_c8 = dStack_d0;
        local_48 = dStack_b0;
        dVar1 = cos(local_60);
        local_e0 = local_48 * dVar1 + local_c8;
      }
      else {
        FindLinearRoot(&local_d8,&local_b8,&local_e0);
      }
      local_d8 = dStack_d0;
      dStack_d0 = local_e0;
      local_b8 = dStack_b0;
      uVar2 = uVar2 + 1;
    }
    *local_a0 = local_78.distance;
    *local_98 = local_78.reverseAzimuth;
    local_a8->latitude = local_88.latitude;
    local_a8->longitude = local_88.longitude;
LAB_00159e04:
    local_a8->latitude = local_88.latitude;
    local_a8->longitude = local_88.longitude;
    DistVincenty(pt2,local_a8,&local_78);
    *local_a0 = local_78.distance;
    *local_98 = local_78.azimuth;
  }
  else {
    LVar3 = PerpIntercept(&loc->geoStart,local_78.azimuth,pt2,crsFromPt,distFromPt,dTol);
    local_88.longitude = LVar3.longitude;
    local_88.latitude = LVar3.latitude;
    LVar3 = PointOnLocusP(loc,&local_88,dTol,5e-16);
    intPt->latitude = LVar3.latitude;
    intPt->longitude = LVar3.longitude;
    DistVincenty(pt2,intPt,&local_78);
    *distFromPt = local_78.distance;
    *crsFromPt = local_78.azimuth;
  }
  return 1;
}

Assistant:

int LocusPerpIntercept(const Locus &loc, const LLPoint &pt2, double &crsFromPt,
                           double &distFromPt, LLPoint &intPt, double dTol)
    {
        InverseResult result;
        DistVincenty(loc.geoStart, loc.geoEnd, result);
        double gcrs = result.azimuth;
        double gdist = result.distance;

        if (fabs(loc.startDist - loc.endDist) < dTol)
        {
            const LLPoint geoPt = PerpIntercept(loc.geoStart, gcrs, pt2, crsFromPt, distFromPt, dTol);
            intPt = PointOnLocusP(loc, geoPt, dTol, kEps);
            DistVincenty(pt2, intPt, result);
            distFromPt = result.distance;
            crsFromPt = result.azimuth;
            return 1;
        }

        DistVincenty(loc.locusStart, loc.locusEnd, result);
        LLPoint locPt = PerpIntercept(loc.locusStart, result.azimuth, pt2, crsFromPt, distFromPt, dTol);
        LLPoint geoPt = PerpIntercept(loc.geoStart, gcrs, locPt, crsFromPt, distFromPt, dTol);
        const double locAngle = atan((loc.startDist - loc.endDist) / gdist);

        double distarray[2], errarray[2];
        distarray[0] = distarray[1] = errarray[0] = errarray[1] = 0.0;

        DistVincenty(loc.geoStart, geoPt, result);
        distarray[1] = result.distance;

        const int maxCount = 15;
        double newDist = 0.0;
        int k = 0;
        while (k == 0 || (!std::isnan(newDist) && fabs(errarray[1]) > dTol && k < maxCount))
        {
            geoPt = DestVincenty(loc.geoStart, gcrs, distarray[1]);
            locPt = PointOnLocusP(loc /*loc.geoStart*/, geoPt, dTol, kEps);

            DistVincenty(locPt, pt2, result);
            errarray[1] = -result.distance * cos(fabs(
                    SignAzimuthDifference(LocusCrsAtPoint(loc, locPt, geoPt, 1e-8), result.azimuth)));

            if (fabs(errarray[1]) < dTol)
            {
                distFromPt = result.distance;
                crsFromPt = result.reverseAzimuth;
                intPt = locPt;
                break;
            }

            if (k == 0)
                newDist = distarray[1] + errarray[1] * cos(locAngle);
            else
                FindLinearRoot(distarray, errarray, newDist);
            distarray[0] = distarray[1];
            distarray[1] = newDist;
            errarray[0] = errarray[1];
            k++;
        }

        intPt = locPt;
        DistVincenty(pt2, intPt, result);
        distFromPt = result.distance;
        crsFromPt = result.azimuth;
        return 1;
    }